

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test::
~SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test
          (SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAssignmentTypeMismatchThrows3)
{
  std::string source = R"SRC(
  fn f(): function
  {
    ret \(x: f32): void = { };
  }
  
  fn main(): f32
  {
    let x: f32 = 12;
    x = f();
    ret 0;
  }
  )SRC";
  throwTest(source);
}